

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O0

ze_result_t
driver::zeMemGetFileDescriptorFromIpcHandleExp
          (ze_context_handle_t hContext,ze_ipc_mem_handle_t ipcHandle,uint64_t *pHandle)

{
  code *pcVar1;
  undefined1 local_68 [64];
  code *local_28;
  ze_pfnMemGetFileDescriptorFromIpcHandleExp_t pfnGetFileDescriptorFromIpcHandleExp;
  uint64_t *puStack_18;
  ze_result_t result;
  uint64_t *pHandle_local;
  ze_context_handle_t hContext_local;
  
  pcVar1 = DAT_0011c550;
  pfnGetFileDescriptorFromIpcHandleExp._4_4_ = ZE_RESULT_SUCCESS;
  local_28 = DAT_0011c550;
  if (DAT_0011c550 != (code *)0x0) {
    puStack_18 = pHandle;
    pHandle_local = (uint64_t *)hContext;
    memcpy(local_68,&ipcHandle,0x40);
    pfnGetFileDescriptorFromIpcHandleExp._4_4_ = (*pcVar1)(hContext,puStack_18);
  }
  return pfnGetFileDescriptorFromIpcHandleExp._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeMemGetFileDescriptorFromIpcHandleExp(
        ze_context_handle_t hContext,                   ///< [in] handle of the context object
        ze_ipc_mem_handle_t ipcHandle,                  ///< [in] IPC memory handle
        uint64_t* pHandle                               ///< [out] Returned file descriptor
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnGetFileDescriptorFromIpcHandleExp = context.zeDdiTable.MemExp.pfnGetFileDescriptorFromIpcHandleExp;
        if( nullptr != pfnGetFileDescriptorFromIpcHandleExp )
        {
            result = pfnGetFileDescriptorFromIpcHandleExp( hContext, ipcHandle, pHandle );
        }
        else
        {
            // generic implementation
        }

        return result;
    }